

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O2

bool __thiscall cmsys::Glob::FindFiles(Glob *this,string *inexpr,GlobMessages *messages)

{
  char cVar1;
  bool bVar2;
  bool collapse;
  size_type sVar3;
  ulong uVar4;
  string *this_00;
  size_type sVar5;
  string expr;
  string local_b8;
  string fexpr;
  string cexpr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cexpr._M_dataplus._M_p = (pointer)&cexpr.field_2;
  cexpr._M_string_length = 0;
  cexpr.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&expr,(string *)inexpr);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
            (&this->Internals->Expressions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->Internals->Files);
  bVar2 = SystemTools::FileIsFullPath(&expr);
  if (!bVar2) {
    SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&fexpr,(SystemTools *)0x1,collapse);
    std::__cxx11::string::operator=((string *)&expr,(string *)&fexpr);
    std::__cxx11::string::~string((string *)&fexpr);
    std::operator+(&fexpr,"/",inexpr);
    std::__cxx11::string::append((string *)&expr);
    std::__cxx11::string::~string((string *)&fexpr);
  }
  std::__cxx11::string::string((string *)&fexpr,(string *)&expr);
  sVar5 = 0;
  for (sVar3 = 0; expr._M_string_length != sVar3; sVar3 = sVar3 + 1) {
    if (sVar3 != 0) {
      cVar1 = expr._M_dataplus._M_p[sVar3];
      if (((cVar1 == '*') || (cVar1 == '[')) || (cVar1 == '?')) {
        if (expr._M_dataplus._M_p[sVar3 - 1] != '\\') break;
      }
      else if ((cVar1 == '/') && (expr._M_dataplus._M_p[sVar3 - 1] != '\\')) {
        sVar5 = sVar3;
      }
    }
  }
  if ((sVar5 == 0) && ((expr._M_dataplus._M_p[1] != ':' || (*expr._M_dataplus._M_p == '/')))) {
    bVar2 = true;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)&expr);
    std::__cxx11::string::operator=((string *)&expr,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    bVar2 = false;
  }
  std::__cxx11::string::assign((char *)&cexpr);
  for (uVar4 = 0; uVar4 < expr._M_string_length; uVar4 = uVar4 + 1) {
    if (expr._M_dataplus._M_p[uVar4] == '/') {
      if (cexpr._M_string_length != 0) {
        AddExpression(this,&cexpr);
      }
      std::__cxx11::string::assign((char *)&cexpr);
    }
    else {
      std::__cxx11::string::append((ulong)&cexpr,'\x01');
    }
  }
  if (cexpr._M_string_length != 0) {
    AddExpression(this,&cexpr);
  }
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"/",(allocator<char> *)&local_50);
    ProcessDirectory(this,0,&local_b8,messages);
    this_00 = &local_b8;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&fexpr);
    std::operator+(&local_b8,&local_50,"/");
    ProcessDirectory(this,0,&local_b8,messages);
    std::__cxx11::string::~string((string *)&local_b8);
    this_00 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&fexpr);
  std::__cxx11::string::~string((string *)&expr);
  std::__cxx11::string::~string((string *)&cexpr);
  return true;
}

Assistant:

bool Glob::FindFiles(const std::string& inexpr, GlobMessages* messages)
{
  std::string cexpr;
  std::string::size_type cc;
  std::string expr = inexpr;

  this->Internals->Expressions.clear();
  this->Internals->Files.clear();

  if (!kwsys::SystemTools::FileIsFullPath(expr)) {
    expr = kwsys::SystemTools::GetCurrentWorkingDirectory();
    expr += "/" + inexpr;
  }
  std::string fexpr = expr;

  std::string::size_type skip = 0;
  std::string::size_type last_slash = 0;
  for (cc = 0; cc < expr.size(); cc++) {
    if (cc > 0 && expr[cc] == '/' && expr[cc - 1] != '\\') {
      last_slash = cc;
    }
    if (cc > 0 && (expr[cc] == '[' || expr[cc] == '?' || expr[cc] == '*') &&
        expr[cc - 1] != '\\') {
      break;
    }
  }
  if (last_slash > 0) {
    // std::cout << "I can skip: " << fexpr.substr(0, last_slash)
    // << std::endl;
    skip = last_slash;
  }
  if (skip == 0) {
#if defined(KWSYS_GLOB_SUPPORT_NETWORK_PATHS)
    // Handle network paths
    if (expr[0] == '/' && expr[1] == '/') {
      int cnt = 0;
      for (cc = 2; cc < expr.size(); cc++) {
        if (expr[cc] == '/') {
          cnt++;
          if (cnt == 2) {
            break;
          }
        }
      }
      skip = int(cc + 1);
    } else
#endif
      // Handle drive letters on Windows
      if (expr[1] == ':' && expr[0] != '/') {
      skip = 2;
    }
  }

  if (skip > 0) {
    expr = expr.substr(skip);
  }

  cexpr = "";
  for (cc = 0; cc < expr.size(); cc++) {
    int ch = expr[cc];
    if (ch == '/') {
      if (!cexpr.empty()) {
        this->AddExpression(cexpr);
      }
      cexpr = "";
    } else {
      cexpr.append(1, static_cast<char>(ch));
    }
  }
  if (!cexpr.empty()) {
    this->AddExpression(cexpr);
  }

  // Handle network paths
  if (skip > 0) {
    this->ProcessDirectory(0, fexpr.substr(0, skip) + "/", messages);
  } else {
    this->ProcessDirectory(0, "/", messages);
  }
  return true;
}